

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.h
# Opt level: O2

void __thiscall
r_exec::IPGMContext::copy_structure<r_exec::View>
          (IPGMContext *this,View *destination,uint16_t write_index,uint16_t *extent_index,
          bool dereference_cptr,int64_t pgm_index)

{
  Atom *pAVar1;
  ushort uVar2;
  View *pVVar3;
  char cVar4;
  bool bVar5;
  uint16_t opcode;
  ushort uVar6;
  short sVar7;
  int iVar8;
  undefined7 in_register_00000081;
  uint16_t i;
  uint uVar9;
  Atom local_84 [4];
  ulong local_80;
  undefined4 local_74;
  View *local_70;
  uint16_t *local_68;
  Atom a;
  undefined4 uStack_5c;
  
  local_74 = (undefined4)CONCAT71(in_register_00000081,dereference_cptr);
  local_80 = pgm_index;
  local_70 = destination;
  local_68 = extent_index;
  cVar4 = r_code::Atom::getDescriptor();
  if (cVar4 == -0x3b) {
    opcode = r_code::Atom::asOpcode();
    Operator::Get((Operator *)&a,opcode);
    if ((code *)CONCAT44(uStack_5c,_a) == syn) {
      getChild((IPGMContext *)&a,this,1);
      copy_member<r_exec::View>
                ((IPGMContext *)&a,local_70,write_index,local_68,(bool)(byte)local_74,local_80);
      return;
    }
  }
  pVVar3 = local_70;
  r_code::Atom::operator=
            ((Atom *)((long)(local_70->super_View).references + (ulong)write_index * 4 + 0x18),
             (this->super__Context).code + (ulong)(this->super__Context).index * 4);
  iVar8 = (*(this->super__Context)._vptr__Context[6])(this);
  uVar2 = (ushort)iVar8;
  *local_68 = uVar2 + write_index + 1;
  cVar4 = r_code::Atom::getDescriptor();
  if (cVar4 != -0x40) {
    if (cVar4 == -0x39) {
      for (uVar6 = 1; uVar6 <= uVar2; uVar6 = uVar6 + 1) {
        r_code::Atom::operator=
                  ((Atom *)((long)(pVVar3->super_View).references +
                           (ulong)(ushort)(write_index + uVar6) * 4 + 0x18),
                   (this->super__Context).code +
                   (ulong)uVar6 * 4 + (ulong)(this->super__Context).index * 4);
      }
      return;
    }
    bVar5 = is_cmd_with_cptr(this);
    if (!bVar5) {
      if ((long)local_80 < 0) {
        cVar4 = r_code::Atom::getDescriptor();
        local_80 = 0xffffffffffffffff;
        if ((cVar4 == -0x3d) &&
           ((sVar7 = r_code::Atom::asOpcode(), sVar7 == Opcodes::Pgm ||
            (sVar7 = r_code::Atom::asOpcode(), sVar7 == Opcodes::AntiPgm)))) {
          local_80 = (ulong)(this->super__Context).index;
        }
      }
      for (uVar6 = 1; uVar6 <= uVar2; uVar6 = uVar6 + 1) {
        getChild((IPGMContext *)&a,this,uVar6);
        copy_member<r_exec::View>
                  ((IPGMContext *)&a,local_70,write_index + uVar6,local_68,
                   (bool)(uVar6 != 1 | (byte)local_74),local_80);
      }
      return;
    }
    for (uVar6 = 1; uVar6 <= uVar2; uVar6 = uVar6 + 1) {
      getChild((IPGMContext *)&a,this,uVar6);
      copy_member<r_exec::View>
                ((IPGMContext *)&a,local_70,write_index + uVar6,local_68,uVar6 != 2,local_80);
    }
    return;
  }
  uVar9 = write_index + 1;
  cVar4 = r_code::Atom::getDescriptor();
  if (cVar4 != -0x7a) {
    r_code::Atom::operator=
              ((Atom *)((long)(pVVar3->super_View).references + (ulong)(uVar9 & 0xffff) * 4 + 0x18),
               (this->super__Context).code + (ulong)(this->super__Context).index * 4 + 4);
    goto LAB_001a78c7;
  }
  pAVar1 = (this->super__Context).code;
  uVar6 = r_code::Atom::asIndex();
  _a = *(undefined4 *)(pAVar1 + (ulong)uVar6 * 4);
  cVar4 = r_code::Atom::getDescriptor();
  if (cVar4 == -0x7c) {
    pAVar1 = (this->super__Context).code;
    uVar6 = r_code::Atom::asIndex();
    r_code::Atom::operator=(&a,pAVar1 + (ulong)uVar6 * 4);
  }
  cVar4 = r_code::Atom::getDescriptor();
  if (cVar4 == -0x78) {
    r_code::Atom::asInputIndex();
    r_code::Atom::RPointer((ushort)local_84);
    r_code::Atom::operator=
              ((Atom *)((long)(pVVar3->super_View).references + (ulong)(uVar9 & 0xffff) * 4 + 0x18),
               local_84);
LAB_001a788d:
    r_code::Atom::~Atom(local_84);
  }
  else {
    if (cVar4 == -0x75) {
      r_code::Atom::asIndex();
      uVar6 = r_code::Atom::asIndex();
      r_code::Atom::VLPointer((ushort)local_84,uVar6);
      r_code::Atom::operator=
                ((Atom *)((long)(pVVar3->super_View).references + (ulong)(uVar9 & 0xffff) * 4 + 0x18
                         ),local_84);
      goto LAB_001a788d;
    }
    r_code::Atom::operator=
              ((Atom *)((long)(pVVar3->super_View).references + (ulong)(uVar9 & 0xffff) * 4 + 0x18),
               (this->super__Context).code + (ulong)(this->super__Context).index * 4 + 4);
  }
  r_code::Atom::~Atom(&a);
LAB_001a78c7:
  for (uVar6 = 2; uVar6 <= uVar2; uVar6 = uVar6 + 1) {
    r_code::Atom::operator=
              ((Atom *)((long)(pVVar3->super_View).references +
                       (ulong)(ushort)(write_index + uVar6) * 4 + 0x18),
               (this->super__Context).code +
               (ulong)uVar6 * 4 + (ulong)(this->super__Context).index * 4);
  }
  return;
}

Assistant:

void copy_structure(C *destination,
                                          uint16_t write_index,
                                          uint16_t &extent_index,
                                          bool dereference_cptr,
                                          int64_t pgm_index) const   // assumes the context is a structure; C: Object or View.
    {
        if ((*this)[0].getDescriptor() == Atom::OPERATOR && Operator::Get((*this)[0].asOpcode()).is_syn()) { // (\ (expression ...)).
            IPGMContext c = getChild(1);
            c.copy_member(destination, write_index, extent_index, dereference_cptr, pgm_index);
        } else {
            destination->code(write_index++) = (*this)[0];
            uint16_t atom_count = getChildrenCount();
            extent_index = write_index + atom_count;

            switch ((*this)[0].getDescriptor()) {
            case Atom::C_PTR: // copy members as is (no dereference).
                if ((*this)[1].getDescriptor() == Atom::VL_PTR) {
                    Atom a = code[(*this)[1].asIndex()];

                    if (a.getDescriptor() == Atom::I_PTR) {
                        a = code[a.asIndex()];
                    }

                    switch (a.getDescriptor()) {
                    case Atom::OUT_OBJ_PTR:
                        destination->code(write_index++) = Atom::VLPointer(code[(*this)[1].asIndex()].asIndex());
                        break;

                    case Atom::IN_OBJ_PTR: // TMP: assumes destination is a mk.rdx.
                        destination->code(write_index++) = Atom::RPointer(1 + a.asInputIndex());
                        break;

                    default:
                        destination->code(write_index++) = (*this)[1];
                        break;
                    }
                } else {
                    destination->code(write_index++) = (*this)[1];
                }

                for (uint16_t i = 2; i <= atom_count; ++i) {
                    destination->code(write_index++) = (*this)[i];
                }

                break;

            case Atom::TIMESTAMP: // copy members as is (no dereference).
                for (uint16_t i = 1; i <= atom_count; ++i) {
                    destination->code(write_index++) = (*this)[i];
                }

                break;

            default:
                if (is_cmd_with_cptr()) {
                    for (uint16_t i = 1; i <= atom_count; ++i) {
                        IPGMContext c = getChild(i);
                        c.copy_member(destination, write_index++, extent_index, i != 2, pgm_index);
                    }
                } else { // if a pgm is being copied, indicate the starting index of the pgm so that we can turn on code patching and know if a cptr is referencing code inside the pgm (in that case it will not be dereferenced).
                    int64_t _pgm_index;

                    if (pgm_index >= 0) {
                        _pgm_index = pgm_index;
                    } else if ((*this)[0].getDescriptor() == Atom::OBJECT && ((*this)[0].asOpcode() == Opcodes::Pgm || (*this)[0].asOpcode() == Opcodes::AntiPgm)) {
                        _pgm_index = index;
                    } else {
                        _pgm_index = -1;
                    }

                    for (uint16_t i = 1; i <= atom_count; ++i) {
                        IPGMContext c = getChild(i);
                        c.copy_member(destination, write_index++, extent_index, !(!dereference_cptr && i == 1), _pgm_index);
                    }
                }

                break;
            }
        }
    }